

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pluginlist.cpp
# Opt level: O0

void __thiscall ON_PlugInRef::Dump(ON_PlugInRef *this,ON_TextLog *text_log)

{
  ON_String this_00;
  char *pcVar1;
  ON_String local_20;
  ON_String plugin_sdk_version;
  ON_TextLog *text_log_local;
  ON_PlugInRef *this_local;
  
  plugin_sdk_version.m_s = (char *)text_log;
  ON_TextLog::Print(text_log,"Plug-in executable information:\n");
  ON_TextLog::PushIndent((ON_TextLog *)plugin_sdk_version.m_s);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"id = ");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,&this->m_plugin_id);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"\n");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"type = %d\n",
                    (ulong)(uint)this->m_plugin_type);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"platform = %d\n",
                    (ulong)(uint)this->m_plugin_platform);
  ON_SdkVersionNumberToString((uint)&local_20,this->m_plugin_sdk_version);
  this_00 = plugin_sdk_version;
  pcVar1 = ON_String::operator_cast_to_char_(&local_20);
  ON_TextLog::Print((ON_TextLog *)this_00.m_s,"sdk version = %s\n",pcVar1);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"name = ");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,&this->m_plugin_name);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"\n");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"version = ");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,&this->m_plugin_version);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"\n");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"file name = ");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,&this->m_plugin_filename);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"\n");
  ON_TextLog::PopIndent((ON_TextLog *)plugin_sdk_version.m_s);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"Developer information:\n");
  ON_TextLog::PushIndent((ON_TextLog *)plugin_sdk_version.m_s);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"website url = ");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,&this->m_developer_website);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"\n");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"update url = ");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,&this->m_developer_updateurl);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"\n");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"organization = ");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,&this->m_developer_organization);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"\n");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"address = ");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,&this->m_developer_address);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"\n");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"country = ");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,&this->m_developer_country);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"\n");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"voice = ");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,&this->m_developer_phone);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"\n");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"email = ");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,&this->m_developer_email);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"\n");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"fax = ");
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,&this->m_developer_fax);
  ON_TextLog::Print((ON_TextLog *)plugin_sdk_version.m_s,"\n");
  ON_TextLog::PopIndent((ON_TextLog *)plugin_sdk_version.m_s);
  ON_String::~ON_String(&local_20);
  return;
}

Assistant:

void ON_PlugInRef::Dump(ON_TextLog& text_log) const
{
  text_log.Print("Plug-in executable information:\n");
  text_log.PushIndent();
  text_log.Print("id = ");text_log.Print(m_plugin_id);text_log.Print("\n");
  text_log.Print("type = %d\n",m_plugin_type);
  text_log.Print("platform = %d\n",m_plugin_platform);

  const ON_String plugin_sdk_version = ON_SdkVersionNumberToString(m_plugin_sdk_version,m_plugin_sdk_service_release);
  text_log.Print(
    "sdk version = %s\n",
    static_cast<const char*>(plugin_sdk_version)
  );

  text_log.Print("name = "); text_log.Print(m_plugin_name); text_log.Print("\n");
  text_log.Print("version = "); text_log.Print(m_plugin_version); text_log.Print("\n");
  text_log.Print("file name = "); text_log.Print(m_plugin_filename); text_log.Print("\n");
  text_log.PopIndent();

  text_log.Print("Developer information:\n");
  text_log.PushIndent();
  text_log.Print("website url = ");text_log.Print(m_developer_website); text_log.Print("\n");
  text_log.Print("update url = ");text_log.Print(m_developer_updateurl); text_log.Print("\n");
  text_log.Print("organization = ");text_log.Print(m_developer_organization); text_log.Print("\n");
  text_log.Print("address = ");text_log.Print(m_developer_address); text_log.Print("\n");
  text_log.Print("country = ");text_log.Print(m_developer_country); text_log.Print("\n");
  text_log.Print("voice = ");text_log.Print(m_developer_phone); text_log.Print("\n");
  text_log.Print("email = ");text_log.Print(m_developer_email); text_log.Print("\n");
  text_log.Print("fax = ");text_log.Print(m_developer_fax); text_log.Print("\n");
  text_log.PopIndent();

}